

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclUpsizePerformInt(SC_Lib *pLib,Abc_Ntk_t *pNtk,SC_SizePars *pPars)

{
  int iVar1;
  Vec_Que_t *pVVar2;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  float *pfVar3;
  bool bVar4;
  Abc_Ntk_t *pNtk_00;
  SC_Lib *pLib_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  SC_Man *p;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *vCone;
  FILE *__stream;
  char *pcVar11;
  Vec_Ptr_t *pVVar12;
  abctime aVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  Vec_Flt_t *pVVar18;
  ulong uVar19;
  int iVar20;
  SC_SizePars *pSVar21;
  Abc_Ntk_t *pAVar22;
  size_t __size;
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  timespec ts;
  int in_stack_ffffffffffffff68;
  timespec local_88;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  SC_SizePars *local_58;
  int local_4c;
  long local_48;
  Abc_Ntk_t *local_40;
  SC_Lib *local_38;
  
  iVar6 = pPars->TimeOut;
  local_58 = pPars;
  if ((long)iVar6 == 0) {
    lVar16 = 0;
  }
  else {
    iVar5 = clock_gettime(3,&local_88);
    if (iVar5 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar16 = lVar16 + (long)iVar6 * 1000000;
  }
  pSVar21 = local_58;
  if (local_58->fVerbose != 0) {
    printf("Parameters: ");
    printf("Iters =%5d.  ",(ulong)(uint)pSVar21->nIters);
    printf("Time win =%3d %%. ",(ulong)(uint)pSVar21->Window);
    printf("Update ratio =%3d %%. ",(ulong)(uint)pSVar21->Ratio);
    printf("UseDept =%2d. ",(ulong)(uint)pSVar21->fUseDept);
    printf("UseWL =%2d. ",(ulong)(uint)pSVar21->fUseWireLoads);
    printf("Target =%5d ps. ",(ulong)(uint)pSVar21->DelayUser);
    printf("DelayGap =%3d ps. ",(ulong)(uint)pSVar21->DelayGap);
    printf("Timeout =%4d sec",(ulong)(uint)pSVar21->TimeOut);
    putchar(10);
  }
  if (pSVar21->Window == 1) {
    pSVar21->Window = (40000 < pNtk->nObjCounts[7]) + 1;
  }
  p = Abc_SclManStart(pLib,pNtk,pSVar21->fUseWireLoads,pSVar21->fUseDept,0.0,pSVar21->BuffTreeEst);
  iVar6 = clock_gettime(3,&local_88);
  if (iVar6 < 0) {
    aVar13 = -1;
  }
  else {
    aVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
  }
  p->timeTotal = aVar13;
  local_38 = pLib;
  if (p->vGatesBest != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGatesBest == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                  ,0x37f,"void Abc_SclUpsizePerformInt(SC_Lib *, Abc_Ntk_t *, SC_SizePars *)");
  }
  pVVar10 = p->pNtk->vGates;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar6 = pVVar10->nSize;
  pVVar8->nSize = iVar6;
  pVVar8->nCap = iVar6;
  local_40 = pNtk;
  if ((long)iVar6 == 0) {
    __size = 0;
    piVar9 = (int *)0x0;
  }
  else {
    __size = (long)iVar6 << 2;
    piVar9 = (int *)malloc(__size);
  }
  pVVar8->pArray = piVar9;
  memcpy(piVar9,pVVar10->pArray,__size);
  pSVar21 = local_58;
  p->vGatesBest = pVVar8;
  fVar23 = p->MaxDelay0;
  p->BestDelay = fVar23;
  if (fVar23 <= (float)local_58->DelayUser) {
    printf("Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n"
           ,(double)fVar23,(double)local_58->DelayUser);
  }
  else if (0 < local_58->nIters) {
    local_70 = -1;
    pVVar10 = (Vec_Int_t *)0x0;
    pVVar8 = (Vec_Int_t *)0x0;
    local_64 = 0;
    local_60 = 0;
    local_68 = 0;
    local_6c = 0;
    local_5c = 0;
    iVar5 = 0;
    iVar6 = 0;
    local_48 = lVar16;
    do {
      iVar20 = pSVar21->Window + (uint)(iVar6 * -0x49249249 + 0xb6db6db6U < 0x24924924);
      local_74 = iVar6;
      local_4c = iVar5;
      if (iVar20 < 0x65) {
        do {
          iVar6 = clock_gettime(3,&local_88);
          if (iVar6 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_88.tv_sec * -1000000;
          }
          pVVar10 = Abc_SclFindCriticalCoWindow(p,iVar20);
          pVVar8 = Abc_SclFindCriticalNodeWindow(p,pVVar10,iVar20,pSVar21->fUseDept);
          iVar6 = clock_gettime(3,&local_88);
          if (iVar6 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
          }
          p->timeCone = p->timeCone + lVar14 + lVar16;
          iVar6 = clock_gettime(3,&local_88);
          if (iVar6 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_88.tv_sec * -1000000;
          }
          if ((pSVar21->BypassFreq == 0 || local_74 == 0) || (local_74 % pSVar21->BypassFreq != 0))
          {
            local_70 = Abc_SclFindUpsizes(p,pVVar8,pSVar21->Ratio,pSVar21->Notches,local_74,
                                          pSVar21->DelayGap,in_stack_ffffffffffffff68);
          }
          else {
            in_stack_ffffffffffffff68 = pSVar21->fVeryVerbose;
            local_70 = Abc_SclFindBypasses(p,pVVar8,0,pSVar21->Notches,local_74,pSVar21->DelayGap,
                                           in_stack_ffffffffffffff68);
          }
          iVar6 = clock_gettime(3,&local_88);
          if (iVar6 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
          }
          p->timeSize = p->timeSize + lVar14 + lVar16;
          iVar6 = clock_gettime(3,&local_88);
          if (iVar6 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_88.tv_sec * -1000000;
          }
          Abc_SclUnmarkCriticalNodeWindow(p,pVVar8);
          Abc_SclUnmarkCriticalNodeWindow(p,pVVar10);
          iVar6 = clock_gettime(3,&local_88);
          if (iVar6 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
          }
          p->timeCone = p->timeCone + lVar14 + lVar16;
          if (0 < local_70) goto LAB_0047e776;
          if (pVVar10->pArray != (int *)0x0) {
            free(pVVar10->pArray);
          }
          free(pVVar10);
          if (pVVar8->pArray != (int *)0x0) {
            free(pVVar8->pArray);
          }
          free(pVVar8);
          iVar6 = iVar20 * 2;
          bVar4 = iVar20 < 0x33;
          iVar20 = iVar6;
        } while (bVar4);
        lVar16 = local_48;
        iVar6 = local_74;
        if (local_70 == 0) goto LAB_0047ea8b;
      }
LAB_0047e776:
      iVar6 = clock_gettime(3,&local_88);
      if (iVar6 < 0) {
        lVar16 = 1;
      }
      else {
        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
        lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_88.tv_sec * -1000000;
      }
      if (pSVar21->fUseDept == 0) {
        vCone = Abc_SclFindTFO(p->pNtk,pVVar8);
        Abc_SclTimeCone(p,vCone);
        local_5c = vCone->nSize;
        if (vCone->pArray != (int *)0x0) {
          free(vCone->pArray);
        }
        free(vCone);
        pSVar21 = local_58;
      }
      else if ((p->vChanged->nSize == 0) ||
              ((local_74 != 0 && pSVar21->BypassFreq != 0 && (local_74 % pSVar21->BypassFreq == 0)))
              ) {
        Abc_SclTimeNtkRecompute(p,(float *)0x0,(float *)0x0,pSVar21->fUseDept,0.0);
      }
      else {
        local_5c = Abc_SclTimeIncUpdate(p);
      }
      iVar6 = clock_gettime(3,&local_88);
      if (iVar6 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      p->timeTime = p->timeTime + lVar14 + lVar16;
      iVar6 = p->vQue->nSize;
      if (iVar6 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      if (iVar6 == 1) {
LAB_0047f89a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar6 = p->vQue->pHeap[1];
      if ((long)iVar6 < 0) goto LAB_0047f89a;
      pVVar12 = p->pNtk->vCos;
      if (pVVar12->nSize <= iVar6) goto LAB_0047f89a;
      uVar7 = *(uint *)((long)pVVar12->pArray[iVar6] + 0x10);
      fVar23 = p->pTimes[uVar7].rise;
      fVar24 = p->pTimes[uVar7].fall;
      if (fVar23 <= fVar24) {
        fVar23 = fVar24;
      }
      p->MaxDelay = fVar23;
      if (p->BestDelay <= fVar23) {
        iVar5 = local_4c + 1;
      }
      else {
        p->BestDelay = fVar23;
        Abc_SclApplyUpdateToBest(p->vGatesBest,p->pNtk->vGates,p->vUpdates);
        p->vUpdates2->nSize = 0;
        iVar5 = 0;
      }
      uVar7 = 1;
      if (pSVar21->fVeryVerbose == 0) {
        uVar7 = (uint)(iVar5 == 0 && pSVar21->fVerbose != 0);
      }
      in_stack_ffffffffffffff68 = local_5c;
      Abc_SclUpsizePrint(p,local_74,iVar20,pVVar10->nSize,pVVar8->nSize,local_70,local_5c,uVar7);
      local_6c = local_6c + pVVar10->nSize;
      local_68 = local_68 + pVVar8->nSize;
      if (pVVar10->pArray != (int *)0x0) {
        free(pVVar10->pArray);
      }
      free(pVVar10);
      lVar16 = local_48;
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
      }
      local_60 = local_60 + local_5c;
      local_64 = local_64 + local_70;
      free(pVVar8);
      if (lVar16 != 0) {
        iVar6 = clock_gettime(3,&local_88);
        if (iVar6 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        iVar6 = local_74;
        if (lVar16 < lVar14) goto LAB_0047ea8b;
      }
      iVar6 = local_74;
      if (((pSVar21->nIterNoChange < iVar5) || (p->BestDelay <= (float)pSVar21->DelayUser)) ||
         (iVar6 = local_74 + 1, pSVar21->nIters <= iVar6)) goto LAB_0047ea8b;
    } while( true );
  }
  local_6c = 0;
  local_68 = 0;
  local_60 = 0;
  local_64 = 0;
  iVar6 = 0;
LAB_0047ea8b:
  pNtk_00 = local_40;
  pAVar22 = p->pNtk;
  pVVar10 = p->vGatesBest;
  p->vGatesBest = pAVar22->vGates;
  pAVar22->vGates = pVVar10;
  if ((pSVar21->BypassFreq != 0) &&
     (Abc_SclUndoRecentChanges(pAVar22,p->vUpdates2), pSVar21->BypassFreq != 0)) {
    Abc_SclUpsizeRemoveDangling(p,pNtk_00);
  }
  Abc_SclTimeNtkRecompute(p,&p->SumArea,&p->MaxDelay,0,0.0);
  if (pSVar21->fVerbose == 0) {
    printf(
          "                                                                                                                                                  \r"
          );
  }
  else {
    iVar5 = iVar6 + (uint)(iVar6 == 0);
    Abc_SclUpsizePrint(p,iVar6,pSVar21->Window,local_6c / iVar5,local_68 / iVar5,local_64 / iVar5,
                       local_60 / iVar5,1);
  }
  iVar5 = 3;
  iVar6 = clock_gettime(3,&local_88);
  if (iVar6 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
  }
  lVar14 = lVar14 - p->timeTotal;
  p->timeTotal = lVar14;
  if (pSVar21->fVerbose != 0) {
    p->timeOther = lVar14 - (p->timeCone + p->timeSize + p->timeTime);
    Abc_Print(iVar5,"%s =","Runtime: Critical path");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeCone * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeCone / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: Sizing eval  ");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeSize * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeSize / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: Timing update");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeTime / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: Other        ");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: TOTAL        ");
    dVar25 = (double)p->timeTotal;
    dVar26 = 0.0;
    if (p->timeTotal != 0) {
      dVar26 = (dVar25 * 100.0) / dVar25;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",dVar25 / 1000000.0,dVar26);
    pSVar21 = local_58;
  }
  if (pSVar21->fDumpStats != 0) {
    __stream = fopen("stats2.txt","a+");
    pcVar11 = p->pNtk->pName;
    iVar6 = strcmp(Abc_SclDumpStats_FileNameOld,pcVar11);
    if (iVar6 == 0) {
      fputc(0x20,__stream);
      fprintf(__stream,"%.1f ",
              ((double)p->pNtk->nObjCounts[7] * 100.0) / (double)Abc_SclDumpStats_nNodesOld);
      fprintf(__stream,"%.1f ",((double)(int)p->SumArea * 100.0) / (double)Abc_SclDumpStats_nAreaOld
             );
      fprintf(__stream,"%.1f ",
              ((double)(int)p->ReportDelay * 100.0) / (double)Abc_SclDumpStats_nDelayOld);
      iVar6 = clock_gettime(3,&local_88);
      if (iVar6 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      fprintf(__stream,"%.2f",(double)(lVar14 - Abc_SclDumpStats_clk) / 1000000.0);
    }
    else {
      strcpy(Abc_SclDumpStats_FileNameOld,pcVar11);
      fputc(10,__stream);
      pcVar11 = Extra_FileNameWithoutPath(p->pNtk->pName);
      fprintf(__stream,"%s ",pcVar11);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPis->nSize);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPos->nSize);
      Abc_SclDumpStats_nNodesOld = p->pNtk->nObjCounts[7];
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nAreaOld = (int)p->SumArea;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nDelayOld = (int)p->ReportDelay;
      fprintf(__stream,"%d ");
      iVar6 = clock_gettime(3,&local_88);
      if (iVar6 < 0) {
        Abc_SclDumpStats_clk = -1;
      }
      else {
        Abc_SclDumpStats_clk = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
    }
    fclose(__stream);
  }
  pLib_00 = local_38;
  if (lVar16 != 0) {
    iVar6 = clock_gettime(3,&local_88);
    if (iVar6 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    if (lVar16 < lVar14) {
      printf("Gate sizing timed out at %d seconds.\n",(ulong)(uint)local_58->TimeOut);
    }
  }
  Abc_SclSclGates2MioGates(pLib_00,pNtk_00);
  pAVar22 = p->pNtk;
  pVVar12 = pAVar22->vCis;
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    do {
      *(undefined4 *)((long)pVVar12->pArray[lVar16] + 0x38) = 0;
      lVar16 = lVar16 + 1;
      pAVar22 = p->pNtk;
      pVVar12 = pAVar22->vCis;
    } while (lVar16 < pVVar12->nSize);
  }
  pVVar12 = pAVar22->vCos;
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    do {
      *(undefined4 *)((long)pVVar12->pArray[lVar16] + 0x38) = 0;
      lVar16 = lVar16 + 1;
      pAVar22 = p->pNtk;
      pVVar12 = pAVar22->vCos;
    } while (lVar16 < pVVar12->nSize);
  }
  pAVar22->pSCLib = (void *)0x0;
  pVVar10 = pAVar22->vGates;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      pAVar22->vGates->pArray = (int *)0x0;
      pVVar10 = pAVar22->vGates;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f144;
    }
    free(pVVar10);
    pAVar22->vGates = (Vec_Int_t *)0x0;
  }
LAB_0047f144:
  pVVar10 = p->vNodeIter;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vNodeIter->pArray = (int *)0x0;
      pVVar10 = p->vNodeIter;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f18c;
    }
    free(pVVar10);
    p->vNodeIter = (Vec_Int_t *)0x0;
  }
LAB_0047f18c:
  pVVar2 = p->vNodeByGain;
  if (pVVar2 != (Vec_Que_t *)0x0) {
    if (pVVar2->pOrder != (int *)0x0) {
      free(pVVar2->pOrder);
      pVVar2->pOrder = (int *)0x0;
    }
    if (pVVar2->pHeap != (int *)0x0) {
      free(pVVar2->pHeap);
    }
    free(pVVar2);
  }
  p->vNodeByGain = (Vec_Que_t *)0x0;
  pVVar18 = p->vNode2Gain;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vNode2Gain->pArray = (float *)0x0;
      pVVar18 = p->vNode2Gain;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f217;
    }
    free(pVVar18);
    p->vNode2Gain = (Vec_Flt_t *)0x0;
  }
LAB_0047f217:
  pVVar10 = p->vNode2Gate;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vNode2Gate->pArray = (int *)0x0;
      pVVar10 = p->vNode2Gate;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f25f;
    }
    free(pVVar10);
    p->vNode2Gate = (Vec_Int_t *)0x0;
  }
LAB_0047f25f:
  pVVar18 = p->vLoads2;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vLoads2->pArray = (float *)0x0;
      pVVar18 = p->vLoads2;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f2a7;
    }
    free(pVVar18);
    p->vLoads2 = (Vec_Flt_t *)0x0;
  }
LAB_0047f2a7:
  pVVar18 = p->vLoads3;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vLoads3->pArray = (float *)0x0;
      pVVar18 = p->vLoads3;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f2ef;
    }
    free(pVVar18);
    p->vLoads3 = (Vec_Flt_t *)0x0;
  }
LAB_0047f2ef:
  pVVar18 = p->vTimes2;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vTimes2->pArray = (float *)0x0;
      pVVar18 = p->vTimes2;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f337;
    }
    free(pVVar18);
    p->vTimes2 = (Vec_Flt_t *)0x0;
  }
LAB_0047f337:
  pVVar18 = p->vTimes3;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vTimes3->pArray = (float *)0x0;
      pVVar18 = p->vTimes3;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f37f;
    }
    free(pVVar18);
    p->vTimes3 = (Vec_Flt_t *)0x0;
  }
LAB_0047f37f:
  pVVar10 = p->vUpdates;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vUpdates->pArray = (int *)0x0;
      pVVar10 = p->vUpdates;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f3bb;
    }
    free(pVVar10);
    p->vUpdates = (Vec_Int_t *)0x0;
  }
LAB_0047f3bb:
  pVVar10 = p->vUpdates2;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vUpdates2->pArray = (int *)0x0;
      pVVar10 = p->vUpdates2;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f3f7;
    }
    free(pVVar10);
    p->vUpdates2 = (Vec_Int_t *)0x0;
  }
LAB_0047f3f7:
  pVVar10 = p->vGatesBest;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vGatesBest->pArray = (int *)0x0;
      pVVar10 = p->vGatesBest;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f433;
    }
    free(pVVar10);
    p->vGatesBest = (Vec_Int_t *)0x0;
  }
LAB_0047f433:
  __ptr = p->vLevels;
  if (__ptr != (Vec_Wec_t *)0x0) {
    iVar6 = __ptr->nCap;
    pVVar10 = __ptr->pArray;
    if (iVar6 < 1) {
      if (pVVar10 != (Vec_Int_t *)0x0) goto LAB_0047f489;
    }
    else {
      lVar14 = 8;
      lVar16 = 0;
      do {
        __ptr_00 = *(void **)((long)&pVVar10->nCap + lVar14);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          pVVar10 = __ptr->pArray;
          *(undefined8 *)((long)&pVVar10->nCap + lVar14) = 0;
          iVar6 = __ptr->nCap;
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x10;
      } while (lVar16 < iVar6);
LAB_0047f489:
      free(pVVar10);
    }
    free(__ptr);
    p->vLevels = (Vec_Wec_t *)0x0;
  }
  pVVar10 = p->vChanged;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vChanged->pArray = (int *)0x0;
      pVVar10 = p->vChanged;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f4e9;
    }
    free(pVVar10);
    p->vChanged = (Vec_Int_t *)0x0;
  }
LAB_0047f4e9:
  pVVar2 = p->vQue;
  iVar6 = pVVar2->nSize;
  if (iVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  iVar5 = pVVar2->nCap;
  if (iVar5 < iVar6) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  uVar7 = iVar6 - 1;
  uVar19 = 0;
  if (iVar6 != 1) {
    uVar19 = 0;
    do {
      if (pVVar2->pOrder[uVar19] < 1) {
        __assert_fail("p->pOrder[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar19 = uVar19 + 1;
    } while (uVar7 != uVar19);
    uVar19 = (ulong)uVar7;
  }
  if ((int)uVar19 < iVar5) {
    piVar9 = pVVar2->pOrder + uVar19;
    do {
      if (*piVar9 != -1) {
        __assert_fail("p->pOrder[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar17 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar17;
      piVar9 = piVar9 + 1;
    } while ((int)uVar17 < iVar5);
  }
  piVar9 = pVVar2->pHeap;
  if (*piVar9 != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,300,"void Vec_QueCheck(Vec_Que_t *)");
  }
  if (iVar6 == 1) {
    uVar19 = 0;
  }
  else {
    uVar19 = 1;
    if (1 < (int)uVar7) {
      uVar19 = (ulong)uVar7;
    }
    uVar15 = 0;
    do {
      if (uVar15 != (uint)piVar9[pVVar2->pOrder[uVar15]]) {
        __assert_fail("p->pHeap[p->pOrder[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar15 = uVar15 + 1;
    } while (uVar19 != uVar15);
  }
  while (uVar19 = uVar19 + 1, (long)uVar19 < (long)iVar5) {
    if (piVar9[uVar19] != -1) {
      __assert_fail("p->pHeap[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                    ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  if (iVar6 != 1) {
    iVar5 = 2;
    if (2 < iVar6) {
      iVar5 = iVar6;
    }
    uVar19 = 2;
    iVar20 = 3;
    lVar16 = 0x200000000;
    do {
      if ((int)uVar19 < iVar6) {
        iVar1 = *(int *)((long)piVar9 + uVar19 * 2);
        pfVar3 = *pVVar2->pCostsFlt;
        if (pfVar3 == (float *)0x0) {
          fVar23 = (float)iVar1;
          fVar24 = (float)*(int *)((long)piVar9 + (lVar16 >> 0x1e));
        }
        else {
          fVar23 = pfVar3[iVar1];
          fVar24 = pfVar3[*(int *)((long)piVar9 + (lVar16 >> 0x1e))];
        }
        if (fVar23 < fVar24) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      if (iVar20 < iVar6) {
        iVar1 = *(int *)((long)piVar9 + uVar19 * 2);
        pfVar3 = *pVVar2->pCostsFlt;
        if (pfVar3 == (float *)0x0) {
          fVar23 = (float)iVar1;
          fVar24 = (float)piVar9[iVar20];
        }
        else {
          fVar23 = pfVar3[iVar1];
          fVar24 = pfVar3[piVar9[iVar20]];
        }
        if (fVar23 < fVar24) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      lVar16 = lVar16 + 0x200000000;
      uVar19 = uVar19 + 2;
      iVar20 = iVar20 + 2;
    } while ((uint)(iVar5 * 2) != uVar19);
  }
  if (pVVar2->pOrder != (int *)0x0) {
    free(pVVar2->pOrder);
    pVVar2->pOrder = (int *)0x0;
    piVar9 = pVVar2->pHeap;
  }
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(pVVar2);
  p->vQue = (Vec_Que_t *)0x0;
  pVVar18 = p->vTimesOut;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vTimesOut->pArray = (float *)0x0;
      pVVar18 = p->vTimesOut;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f708;
    }
    free(pVVar18);
    p->vTimesOut = (Vec_Flt_t *)0x0;
  }
LAB_0047f708:
  pVVar10 = p->vBestFans;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      p->vBestFans->pArray = (int *)0x0;
      pVVar10 = p->vBestFans;
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0047f750;
    }
    free(pVVar10);
    p->vBestFans = (Vec_Int_t *)0x0;
  }
LAB_0047f750:
  pVVar18 = p->vInDrive;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vInDrive->pArray = (float *)0x0;
      pVVar18 = p->vInDrive;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f78c;
    }
    free(pVVar18);
    p->vInDrive = (Vec_Flt_t *)0x0;
  }
LAB_0047f78c:
  pVVar18 = p->vWireCaps;
  if (pVVar18 != (Vec_Flt_t *)0x0) {
    if (pVVar18->pArray != (float *)0x0) {
      free(pVVar18->pArray);
      p->vWireCaps->pArray = (float *)0x0;
      pVVar18 = p->vWireCaps;
      if (pVVar18 == (Vec_Flt_t *)0x0) goto LAB_0047f7c8;
    }
    free(pVVar18);
    p->vWireCaps = (Vec_Flt_t *)0x0;
  }
LAB_0047f7c8:
  if (p->pLoads != (SC_Pair *)0x0) {
    free(p->pLoads);
    p->pLoads = (SC_Pair *)0x0;
  }
  if (p->pDepts != (SC_Pair *)0x0) {
    free(p->pDepts);
    p->pDepts = (SC_Pair *)0x0;
  }
  if (p->pTimes != (SC_Pair *)0x0) {
    free(p->pTimes);
    p->pTimes = (SC_Pair *)0x0;
  }
  if (p->pSlews != (SC_Pair *)0x0) {
    free(p->pSlews);
  }
  free(p);
  return;
}

Assistant:

void Abc_SclUpsizePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, SC_SizePars * pPars )
{
    SC_Man * p;
    Vec_Int_t * vPathPos = NULL;    // critical POs
    Vec_Int_t * vPathNodes = NULL;  // critical nodes and PIs
    abctime clk, nRuntimeLimit = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    int i = 0, win, nUpsizes = -1, nFramesNoChange = 0, nConeSize = 0;
    int nAllPos, nAllNodes, nAllTfos, nAllUpsizes;
    if ( pPars->fVerbose )
    {
        printf( "Parameters: " );
        printf( "Iters =%5d.  ",          pPars->nIters   );
        printf( "Time win =%3d %%. ",     pPars->Window   );
        printf( "Update ratio =%3d %%. ", pPars->Ratio    );
        printf( "UseDept =%2d. ",         pPars->fUseDept );
        printf( "UseWL =%2d. ",           pPars->fUseWireLoads );
        printf( "Target =%5d ps. ",       pPars->DelayUser );
        printf( "DelayGap =%3d ps. ",     pPars->DelayGap );
        printf( "Timeout =%4d sec",       pPars->TimeOut  );
        printf( "\n" );
    }
    // increase window for larger networks
    if ( pPars->Window == 1 )
        pPars->Window += (Abc_NtkNodeNum(pNtk) > 40000);
    // prepare the manager; collect init stats
    p = Abc_SclManStart( pLib, pNtk, pPars->fUseWireLoads, pPars->fUseDept, 0, pPars->BuffTreeEst );
    p->timeTotal  = Abc_Clock();
    assert( p->vGatesBest == NULL );
    p->vGatesBest = Vec_IntDup( p->pNtk->vGates );
    p->BestDelay  = p->MaxDelay0;
    // perform upsizing
    nAllPos = nAllNodes = nAllTfos = nAllUpsizes = 0;
    if ( p->BestDelay <= pPars->DelayUser )
        printf( "Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n", p->BestDelay, (float)pPars->DelayUser );
    else
    for ( i = 0; i < pPars->nIters; i++ )
    {
        for ( win = pPars->Window + ((i % 7) == 6); win <= 100;  win *= 2 )
        {
            // detect critical path
            clk = Abc_Clock();
            vPathPos   = Abc_SclFindCriticalCoWindow( p, win );
            vPathNodes = Abc_SclFindCriticalNodeWindow( p, vPathPos, win, pPars->fUseDept );
            p->timeCone += Abc_Clock() - clk;

            // selectively upsize the nodes
            clk = Abc_Clock();
            if ( pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0 )
                nUpsizes = Abc_SclFindBypasses( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, pPars->fVeryVerbose );
            else
                nUpsizes = Abc_SclFindUpsizes( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, (pPars->BypassFreq > 0) );
            p->timeSize += Abc_Clock() - clk;

            // unmark critical path
            clk = Abc_Clock();
            Abc_SclUnmarkCriticalNodeWindow( p, vPathNodes );
            Abc_SclUnmarkCriticalNodeWindow( p, vPathPos );
            p->timeCone += Abc_Clock() - clk;
            if ( nUpsizes > 0 )
                break;
            Vec_IntFree( vPathPos );
            Vec_IntFree( vPathNodes );
        }
        if ( nUpsizes == 0 )
            break;

        // update timing information
        clk = Abc_Clock();
        if ( pPars->fUseDept )
        {
            if ( Vec_IntSize(p->vChanged) && !(pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0) )
                nConeSize = Abc_SclTimeIncUpdate( p );
            else
                Abc_SclTimeNtkRecompute( p, NULL, NULL, pPars->fUseDept, 0 );
        }
        else
        {
            Vec_Int_t * vTFO = Abc_SclFindTFO( p->pNtk, vPathNodes );
            Abc_SclTimeCone( p, vTFO );
            nConeSize = Vec_IntSize( vTFO );
            Vec_IntFree( vTFO );
        }
        p->timeTime += Abc_Clock() - clk;
//        Abc_SclUpsizePrintDiffs( p, pLib, pNtk );

        // save the best network
        p->MaxDelay = Abc_SclReadMaxDelay( p );
        if ( p->BestDelay > p->MaxDelay )
        {
            p->BestDelay = p->MaxDelay;
            Abc_SclApplyUpdateToBest( p->vGatesBest, p->pNtk->vGates, p->vUpdates );
            Vec_IntClear( p->vUpdates2 );
            nFramesNoChange = 0;
        }
        else
            nFramesNoChange++;

        // report and cleanup
        Abc_SclUpsizePrint( p, i, win, Vec_IntSize(vPathPos), Vec_IntSize(vPathNodes), nUpsizes, nConeSize, pPars->fVeryVerbose || (pPars->fVerbose && nFramesNoChange == 0) ); //|| (i == nIters-1) );
        nAllPos     += Vec_IntSize(vPathPos);
        nAllNodes   += Vec_IntSize(vPathNodes);
        nAllTfos    += nConeSize;
        nAllUpsizes += nUpsizes;
        Vec_IntFree( vPathPos );
        Vec_IntFree( vPathNodes );
        // check timeout
        if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
            break;
        // check no change
        if ( nFramesNoChange > pPars->nIterNoChange )
            break;
        // check best delay
        if ( p->BestDelay <= pPars->DelayUser )
            break;
    }
    // update for best gates and recompute timing
    ABC_SWAP( Vec_Int_t *, p->vGatesBest, p->pNtk->vGates );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUndoRecentChanges( p->pNtk, p->vUpdates2 );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUpsizeRemoveDangling( p, pNtk );
    Abc_SclTimeNtkRecompute( p, &p->SumArea, &p->MaxDelay, 0, 0 );
    if ( pPars->fVerbose )
        Abc_SclUpsizePrint( p, i, pPars->Window, nAllPos/(i?i:1), nAllNodes/(i?i:1), nAllUpsizes/(i?i:1), nAllTfos/(i?i:1), 1 );
    else
        printf( "                                                                                                                                                  \r" );
    // report runtime
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeCone - p->timeSize - p->timeTime;
        ABC_PRTP( "Runtime: Critical path", p->timeCone,  p->timeTotal );
        ABC_PRTP( "Runtime: Sizing eval  ", p->timeSize,  p->timeTotal );
        ABC_PRTP( "Runtime: Timing update", p->timeTime,  p->timeTotal );
        ABC_PRTP( "Runtime: Other        ", p->timeOther, p->timeTotal );
        ABC_PRTP( "Runtime: TOTAL        ", p->timeTotal, p->timeTotal );
    }
    if ( pPars->fDumpStats )
        Abc_SclDumpStats( p, "stats2.txt", p->timeTotal );
    if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
        printf( "Gate sizing timed out at %d seconds.\n", pPars->TimeOut );

    // save the result and quit
    Abc_SclSclGates2MioGates( pLib, pNtk ); // updates gate pointers
    Abc_SclManFree( p );
//    Abc_NtkCleanMarkAB( pNtk );
}